

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# join_relation_set.cpp
# Opt level: O3

JoinRelationSet * __thiscall
duckdb::JoinRelationSetManager::Union
          (JoinRelationSetManager *this,JoinRelationSet *left,JoinRelationSet *right)

{
  ulong uVar1;
  ulong uVar2;
  _Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_> _Var3;
  _Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_> _Var4;
  ulong uVar5;
  ulong uVar6;
  ulong *__s;
  JoinRelationSet *pJVar7;
  ulong *puVar8;
  idx_t iVar9;
  long lVar10;
  idx_t count;
  ulong uVar11;
  ulong uVar12;
  _Head_base<0UL,_unsigned_long_*,_false> local_40;
  JoinRelationSetManager *local_38;
  
  uVar1 = left->count;
  uVar2 = right->count;
  uVar12 = 0;
  uVar11 = -(ulong)(uVar1 + uVar2 >> 0x3d != 0) | (uVar1 + uVar2) * 8;
  local_38 = this;
  __s = (ulong *)operator_new__(uVar11);
  switchD_01043a80::default(__s,0,uVar11);
  iVar9 = 0;
  if (uVar1 != 0) {
    _Var3.super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl =
         (left->relations).super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>.
         _M_t.super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
         super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
         super__Head_base<0UL,_unsigned_long_*,_false>;
    _Var4.super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl =
         (right->relations).super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>
         ._M_t.super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
         super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
         super__Head_base<0UL,_unsigned_long_*,_false>;
    uVar11 = 0;
    uVar12 = 0;
    puVar8 = __s;
    count = 0;
    do {
      if (uVar12 == uVar2) {
        if (uVar11 < uVar1) {
          count = count + (uVar1 - uVar11);
          do {
            *puVar8 = *(ulong *)((long)_Var3.super__Head_base<0UL,_unsigned_long_*,_false>.
                                       _M_head_impl + uVar11 * 8);
            uVar11 = uVar11 + 1;
            puVar8 = puVar8 + 1;
          } while (uVar1 != uVar11);
        }
        goto LAB_0173bc5b;
      }
      uVar5 = *(ulong *)((long)_Var3.super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl +
                        uVar11 * 8);
      uVar6 = *(ulong *)((long)_Var4.super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl +
                        uVar12 * 8);
      if (uVar5 < uVar6) {
        *puVar8 = uVar5;
        uVar11 = uVar11 + 1;
      }
      else {
        if (uVar6 < uVar5) {
          *puVar8 = uVar6;
        }
        else {
          *puVar8 = uVar5;
          uVar11 = uVar11 + 1;
        }
        uVar12 = uVar12 + 1;
      }
      iVar9 = count + 1;
      puVar8 = puVar8 + 1;
      count = iVar9;
    } while (uVar11 != uVar1);
  }
  count = iVar9;
  if (uVar12 < uVar2) {
    count = (uVar2 + iVar9) - uVar12;
    _Var3.super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl =
         (right->relations).super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>
         ._M_t.super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
         super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
         super__Head_base<0UL,_unsigned_long_*,_false>;
    lVar10 = 0;
    do {
      (__s + iVar9)[lVar10] =
           *(ulong *)(uVar12 * 8 +
                      (long)_Var3.super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl +
                     lVar10 * 8);
      lVar10 = lVar10 + 1;
    } while (uVar2 - uVar12 != lVar10);
  }
LAB_0173bc5b:
  local_40._M_head_impl = __s;
  pJVar7 = GetJoinRelation(local_38,(unsafe_unique_array<idx_t> *)&local_40,count);
  if (local_40._M_head_impl != (ulong *)0x0) {
    operator_delete__(local_40._M_head_impl);
  }
  return pJVar7;
}

Assistant:

JoinRelationSet &JoinRelationSetManager::Union(JoinRelationSet &left, JoinRelationSet &right) {
	auto relations = make_unsafe_uniq_array<idx_t>(left.count + right.count);
	idx_t count = 0;
	// move through the left and right relations, eliminating duplicates
	idx_t i = 0, j = 0;
	while (true) {
		if (i == left.count) {
			// exhausted left relation, add remaining of right relation
			for (; j < right.count; j++) {
				relations[count++] = right.relations[j];
			}
			break;
		} else if (j == right.count) {
			// exhausted right relation, add remaining of left
			for (; i < left.count; i++) {
				relations[count++] = left.relations[i];
			}
			break;
		} else if (left.relations[i] < right.relations[j]) {
			// left is smaller, progress left and add it to the set
			relations[count++] = left.relations[i];
			i++;
		} else if (left.relations[i] > right.relations[j]) {
			// right is smaller, progress right and add it to the set
			relations[count++] = right.relations[j];
			j++;
		} else {
			D_ASSERT(left.relations[i] == right.relations[j]);
			relations[count++] = left.relations[i];
			i++;
			j++;
		}
	}
	return GetJoinRelation(std::move(relations), count);
}